

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-kalman-filter.cpp
# Opt level: O3

MeasureVector __thiscall
stateObservation::LinearKalmanFilter::simulateSensor_
          (LinearKalmanFilter *this,StateVector *x,uint k)

{
  Cmatrix *a;
  double *pdVar1;
  Index *pIVar2;
  double dVar3;
  uint uVar4;
  double *pdVar5;
  ulong uVar6;
  bool bVar7;
  long lVar8;
  uint in_ECX;
  int iVar9;
  char *pcVar10;
  undefined4 in_register_00000014;
  Matrix<double,__1,_1,_0,__1,_1> *rhs;
  long lVar11;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar12;
  ActualDstType actualDst;
  long lVar13;
  void *pvVar14;
  double *pdVar15;
  MeasureVector MVar16;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  local_70;
  void *local_48;
  double *local_40;
  long local_38;
  
  rhs = (Matrix<double,__1,_1,_0,__1,_1> *)CONCAT44(in_register_00000014,k);
  a = (Cmatrix *)(x + 0x10);
  bVar7 = KalmanFilterBase::checkCmatrix((KalmanFilterBase *)x,a);
  if (!bVar7) {
    __assert_fail("checkCmatrix(c_) && \"ERROR: The C is not initialized\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/linear-kalman-filter.cpp"
                  ,0x39,
                  "virtual ObserverBase::MeasureVector stateObservation::LinearKalmanFilter::simulateSensor_(const StateVector &, unsigned int)"
                 );
  }
  pdVar5 = x[0x27].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (*(int *)((long)&(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                      m_rows + 4) != (int)pdVar5) {
LAB_0013b823:
    __assert_fail("checkDmatrix(d_) && \"ERROR: The D is not initialized\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/linear-kalman-filter.cpp"
                  ,0x3a,
                  "virtual ObserverBase::MeasureVector stateObservation::LinearKalmanFilter::simulateSensor_(const StateVector &, unsigned int)"
                 );
  }
  uVar6 = x[0x27].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  iVar9 = (int)uVar6;
  if (*(int *)&x[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      != iVar9) goto LAB_0013b823;
  if (iVar9 == 0) goto LAB_0013b759;
  local_70.m_lhs.m_lhs = (LhsNested)((ulong)pdVar5 & 0xffffffff);
  local_70.m_lhs.m_rhs = (RhsNested)(uVar6 & 0xffffffff);
  local_70.m_rhs.m_lhs = (LhsNested)0x0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_48,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_70);
  pdVar5 = x[0x27].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if ((pdVar5 != local_40) ||
     (lVar8 = x[0x27].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows, lVar8 != local_38)) {
    pcVar10 = 
    "Eigen::CwiseBinaryOp<Eigen::numext::not_equal_to<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::numext::not_equal_to<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
    ;
LAB_0013b7fa:
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar10);
  }
  if (lVar8 < 1) {
    free(local_48);
LAB_0013b759:
    if (x[0x11].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
        (double *)
        (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase._vptr_ObserverBase =
           (_func_int **)0x0;
      (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.n_ = 0;
      (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.m_ = 0;
      lVar8 = x[0x10].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
      if (lVar8 != 0) {
        if (lVar8 < 0) {
LAB_0013b861:
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                       );
        }
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                  ((DenseStorage<double,__1,__1,_1,_0> *)this,lVar8,lVar8,1);
        lVar8._0_4_ = (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.n_;
        lVar8._4_4_ = (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.m_;
        if (lVar8 < 0) {
          __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                        ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                       );
        }
        if (lVar8 != 0) {
          memset((this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.
                 _vptr_ObserverBase,0,lVar8 << 3);
        }
      }
      local_70.m_lhs.m_lhs = (LhsNested)0x3ff0000000000000;
      Eigen::internal::
      generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
      ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((Matrix<double,__1,_1,_0,__1,_1> *)this,a,rhs,(Scalar *)&local_70);
      IVar12 = extraout_RDX_00;
LAB_0013b7d3:
      MVar16.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           IVar12;
      MVar16.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)this;
      return (MeasureVector)
             MVar16.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
    }
  }
  else {
    pIVar2 = &x[0x26].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
    lVar11 = *pIVar2;
    bVar7 = true;
    lVar13 = 0;
    pvVar14 = local_48;
    do {
      if (0 < (long)pdVar5) {
        pdVar15 = (double *)0x0;
        do {
          dVar3 = *(double *)(lVar11 + (long)pdVar15 * 8);
          pdVar1 = (double *)((long)pvVar14 + (long)pdVar15 * 8);
          if ((dVar3 != *pdVar1) || (NAN(dVar3) || NAN(*pdVar1))) goto LAB_0013b619;
          pdVar15 = (double *)((long)pdVar15 + 1);
        } while (pdVar5 != pdVar15);
      }
      lVar13 = lVar13 + 1;
      pvVar14 = (void *)((long)pvVar14 + (long)pdVar5 * 8);
      lVar11 = lVar11 + (long)pdVar5 * 8;
      bVar7 = lVar13 < lVar8;
    } while (lVar13 != lVar8);
LAB_0013b619:
    free(local_48);
    if (!bVar7) goto LAB_0013b759;
    pdVar5 = x[0xe].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    lVar8 = (x[0xb].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             - x[10].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            >> 3) * -0x5555555555555555 +
            (x[0xc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             - (long)x[0xd].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                     .m_data >> 3) * -0x5555555555555555 +
            (((long)pdVar5 -
              (long)x[0xc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_data >> 3) + -1 + (ulong)(pdVar5 == (double *)0x0)) * 0x15;
    if (lVar8 == 0) {
LAB_0013b89f:
      __assert_fail("u_.checkIndex(k) && \"ERROR: The input feedthrough of the measurements is not set                              (the measurement at time k needs the input at time k which was not given)                              if you don\'t need the input in the computation of measurement, you                              must set D matrix to zero\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/linear-kalman-filter.cpp"
                    ,0x42,
                    "virtual ObserverBase::MeasureVector stateObservation::LinearKalmanFilter::simulateSensor_(const StateVector &, unsigned int)"
                   );
    }
    uVar4 = *(uint *)&x[9].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data;
    if ((in_ECX < uVar4) || (lVar8 + (ulong)uVar4 <= (ulong)in_ECX)) goto LAB_0013b89f;
    if (x[0x11].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
        (double *)
        (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      local_70.m_rhs.m_rhs =
           std::
           _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
           ::operator[]((_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                         *)&x[10].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows,(ulong)(in_ECX - uVar4));
      if (x[0x27].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          ((local_70.m_rhs.m_rhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_rows) {
        pcVar10 = 
        "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
        ;
        goto LAB_0013b857;
      }
      pdVar5 = (double *)
               x[0x10].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      local_70.m_lhs.m_lhs = a;
      local_70.m_lhs.m_rhs = rhs;
      local_70.m_rhs.m_lhs = (LhsNested)pIVar2;
      if ((pdVar5 != x[0x27].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data) ||
         (((local_70.m_rhs.m_rhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_cols != 1)) {
        pcVar10 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>]"
        ;
        goto LAB_0013b7fa;
      }
      (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase._vptr_ObserverBase =
           (_func_int **)0x0;
      (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.n_ = 0;
      (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.m_ = 0;
      if ((long)pdVar5 < 0) goto LAB_0013b861;
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                ((DenseStorage<double,__1,__1,_1,_0> *)this,(Index)pdVar5,(Index)pdVar5,1);
      Eigen::internal::
      assignment_from_xpr_op_product<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::add_assign_op<double,double>>
      ::
      run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,_1,_0,__1,_1> *)this,&local_70,
                 (assign_op<double,_double> *)&local_48);
      IVar12 = extraout_RDX;
      goto LAB_0013b7d3;
    }
  }
  pcVar10 = 
  "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
  ;
LAB_0013b857:
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar10);
}

Assistant:

ObserverBase::MeasureVector LinearKalmanFilter::simulateSensor_(const StateVector& x, unsigned k)
    {

        BOOST_ASSERT(checkCmatrix(c_) && "ERROR: The C is not initialized");
        BOOST_ASSERT(checkDmatrix(d_) && "ERROR: The D is not initialized");

        if (p_>0 && d_!=getDmatrixZero())
        {
                BOOST_ASSERT(u_.checkIndex(k) &&
                             "ERROR: The input feedthrough of the measurements is not set \
                             (the measurement at time k needs the input at time k which was not given) \
                             if you don't need the input in the computation of measurement, you \
                             must set D matrix to zero");
                return c_*x+d_*u_[k];

        }
        else
        {
            return ObserverBase::MeasureVector(c_*x);
        }

    }